

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXCompilerLibrary.hpp
# Opt level: O1

void __thiscall
Diligent::DXCompilerLibrary::DXCompilerLibrary
          (DXCompilerLibrary *this,DXCompilerTarget Target,char *LibName)

{
  size_t sVar1;
  char *__s;
  
  this->m_Target = Target;
  __s = "";
  if (LibName != (char *)0x0) {
    __s = LibName;
  }
  (this->m_LibName)._M_dataplus._M_p = (pointer)&(this->m_LibName).field_2;
  sVar1 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->m_LibName,__s,__s + sVar1);
  (this->m_LibraryMtx).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  this->m_Library = (void *)0x0;
  *(undefined8 *)((long)&(this->m_LibraryMtx).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_LibraryMtx).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_LibraryMtx).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_LibraryMtx).super___mutex_base._M_mutex + 8) = 0;
  (this->m_Loaded)._M_base._M_i = false;
  this->m_DxcCreateInstance = (DxcCreateInstanceProc)0x0;
  (this->m_Version).Major = 0;
  (this->m_Version).Minor = 0;
  (this->m_MaxShaderModel).Major = 0;
  (this->m_MaxShaderModel).Minor = 0;
  return;
}

Assistant:

DXCompilerLibrary(DXCompilerTarget Target, const char* LibName) noexcept :
        m_Target{Target},
        m_LibName{LibName != nullptr ? LibName : ""}
    {
    }